

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O1

char * vrna_filename_sanitize(char *name,char *replacement)

{
  int iVar1;
  size_t sVar2;
  void *p;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  
  uVar6 = 0;
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    p = vrna_alloc((int)sVar2 + 1);
    pcVar3 = strpbrk(name,"\\/?%*:|\"<> ");
    pcVar5 = name;
    if (pcVar3 != (char *)0x0) {
      uVar6 = 0;
      do {
        strncpy((char *)((ulong)uVar6 + (long)p),pcVar5,(long)pcVar3 - (long)pcVar5);
        uVar6 = (int)((long)pcVar3 - (long)pcVar5) + uVar6;
        if ((replacement != (char *)0x0) && (*replacement != '\0')) {
          uVar4 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          *(char *)((long)p + uVar4) = *replacement;
        }
        pcVar5 = pcVar3 + 1;
        pcVar3 = strpbrk(pcVar5,"\\/?%*:|\"<> ");
      } while (pcVar3 != (char *)0x0);
    }
    sVar2 = strlen(name);
    if (pcVar5 < name + sVar2) {
      strncpy((char *)((long)p + (ulong)uVar6),pcVar5,
              (ulong)(name + (sVar2 - (long)pcVar5)) & 0xffffffff);
      uVar6 = uVar6 + (int)(name + (sVar2 - (long)pcVar5));
    }
    pcVar5 = (char *)vrna_realloc(p,uVar6 + 1);
    pcVar5[uVar6] = '\0';
    iVar1 = strcmp(pcVar5,".");
    if ((iVar1 == 0) || (iVar1 = strcmp(pcVar5,".."), iVar1 == 0)) {
      pcVar5 = (char *)vrna_realloc(pcVar5,1);
      *pcVar5 = '\0';
    }
    sVar2 = strlen(pcVar5);
    if ((sVar2 & 0xffffff00) != 0) {
      pcVar3 = strrchr(pcVar5,0x2e);
      if (pcVar3 != (char *)0x0) {
        pcVar3 = pcVar5 + ((sVar2 & 0xffffffff) - (long)pcVar3);
        if ((long)pcVar3 < 0xff) {
          memmove(pcVar5 + (0xff - (int)pcVar3),
                  pcVar5 + ((sVar2 & 0xffffffff) - ((ulong)pcVar3 & 0xffffffff)),
                  (ulong)pcVar3 & 0xffffffff);
        }
      }
      pcVar5 = (char *)vrna_realloc(pcVar5,0x100);
      pcVar5[0xff] = '\0';
    }
    return pcVar5;
  }
  return (char *)0x0;
}

Assistant:

PUBLIC char *
vrna_filename_sanitize(const char *name,
                       const char *replacement)
{
  if (name) {
    const char    *ptr, *start, *illegal_chars;
    char          *sanitized_name;
    unsigned int  i, n;

    illegal_chars   = "\\/?%*:|\"<> ";
    sanitized_name  = (char *)vrna_alloc(sizeof(char) * (strlen(name) + 1));
    start           = name;
    i               = 0;
    while ((ptr = strpbrk(start, illegal_chars))) {
      /* find illegal chars */
      strncpy(sanitized_name + i, start, ptr - start);
      i += ptr - start;
      if (replacement && (*replacement))
        sanitized_name[i++] = *replacement;

      start = ptr + 1; /* skip invalid character */
    }
    /* copy remaining part */
    if (start < (name + strlen(name))) {
      unsigned int diff = name - start + strlen(name);
      strncpy(sanitized_name + i, start, diff);
      i += diff;
    }

    /* resize the output string to actual requirements */
    sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char) * (i + 1));
    sanitized_name[i] = '\0';

    /* check for reserved unix file names */
    if ((!strcmp(sanitized_name, ".")) || (!strcmp(sanitized_name, ".."))) {
      sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char));
      sanitized_name[0] = '\0';
    }

    /* check for length restrictions */
    n = strlen(sanitized_name);
    if (n > 255) {
      char *suff = NULL;
      /* try to leave file suffix, i.e. everything after last dot '.', intact */
      if ((suff = strrchr(sanitized_name, '.')) && (sanitized_name + n - suff < 255)) {
        unsigned int n_suff = sanitized_name + n - suff;
        memmove(sanitized_name + (255 - n_suff), sanitized_name + n - n_suff,
                sizeof(char) * n_suff);
      }

      sanitized_name      = (char *)vrna_realloc(sanitized_name, sizeof(char) * 256);
      sanitized_name[255] = '\0';
    }

    /* finally, return the sanitized file name */
    return sanitized_name;
  } else {
    return NULL;
  }
}